

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::visitModule(Reducer *this,Module *curr)

{
  uintptr_t uVar1;
  Expression *pEVar2;
  bool bVar3;
  bool bVar4;
  pointer pMVar5;
  ostream *poVar6;
  reference this_00;
  type __x;
  size_type sVar7;
  int *piVar8;
  reference pvVar9;
  long lVar10;
  reference pEVar11;
  size_t *psVar12;
  unsigned_long *puVar13;
  iterator iVar14;
  iterator iVar15;
  reference this_01;
  pointer this_02;
  Expression **ppEVar16;
  Type params;
  Name NVar17;
  Name NVar18;
  Iterator IVar19;
  bool local_339;
  Signature local_268;
  HeapType local_258;
  BasicType local_24c;
  Expression *local_248;
  Expression *child;
  Self *local_238;
  Index local_230;
  undefined1 local_228 [8];
  Iterator __end3_1;
  undefined1 local_208 [8];
  Iterator __begin3_1;
  ChildIterator *__range3_1;
  Expression *funcBody;
  HeapType funcType;
  Function *func;
  unsigned_long uStack_178;
  bool allTablesEmpty;
  unsigned_long local_170 [2];
  ulong local_160;
  size_t sStack_158;
  Export exp_2;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Export,_std::allocator<wasm::Export>_> *__range3;
  ProgramResult result;
  undefined1 auStack_c8 [8];
  value_type exp_1;
  long local_98;
  size_t j;
  vector<wasm::Export,_std::allocator<wasm::Export>_> currExports;
  ulong local_70;
  size_t i;
  size_t skip;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  vector<wasm::Export,_std::allocator<wasm::Export>_> exports;
  Module *curr_local;
  Reducer *this_local;
  
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::get(&this->module);
  if (curr != pMVar5) {
    __assert_fail("curr == module.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                  ,0x3a9,"void Reducer::visitModule(Module *)");
  }
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    bVar3 = reduceFunctions(this);
  } while (bVar3);
  shrinkElementSegments(this);
  poVar6 = std::operator<<((ostream *)&std::cerr,"|    try to remove exports (with factor ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->factor);
  std::operator<<(poVar6,")\n");
  std::vector<wasm::Export,_std::allocator<wasm::Export>_>::vector
            ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1);
  pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&pMVar5->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&pMVar5->exports);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&exp), bVar3) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end1);
    __x = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator*(this_00);
    std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
              ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1,__x);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  }
  i = 1;
  for (local_70 = 0;
      sVar7 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                        ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1),
      local_70 < sVar7; local_70 = local_70 + 1) {
    currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = this->factor / 100 + 1;
    currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1000;
    piVar8 = std::max<int>((int *)((long)&currExports.
                                          super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                           (int *)&currExports.
                                   super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = shouldTryToReduce(this,(long)*piVar8);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::vector<wasm::Export,_std::allocator<wasm::Export>_>::vector
                ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
      local_98 = 0;
      while( true ) {
        sVar7 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                          ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        bVar3 = false;
        if (sVar7 < i) {
          sVar7 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                            ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1);
          bVar3 = local_70 + local_98 < sVar7;
        }
        if (!bVar3) break;
        pvVar9 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::operator[]
                           ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1,
                            local_70 + local_98);
        exp_1.value.super_IString.str._M_str = *(char **)&pvVar9->kind;
        auStack_c8 = (undefined1  [8])(pvVar9->name).super_IString.str._M_len;
        exp_1.name.super_IString.str._M_len = (size_t)(pvVar9->name).super_IString.str._M_str;
        exp_1.name.super_IString.str._M_str = (char *)(pvVar9->value).super_IString.str._M_len;
        exp_1.value.super_IString.str._M_len = (size_t)(pvVar9->value).super_IString.str._M_str;
        pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                           (&this->module);
        NVar17.super_IString.str._M_str = (char *)auStack_c8;
        NVar17.super_IString.str._M_len = (size_t)pMVar5;
        lVar10 = wasm::Module::getExportOrNull(NVar17);
        if (lVar10 != 0) {
          std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
                    ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j,
                     (value_type *)auStack_c8);
          pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                             (&this->module);
          result.time = (double)auStack_c8;
          NVar18.super_IString.str._M_str = (char *)auStack_c8;
          NVar18.super_IString.str._M_len = (size_t)pMVar5;
          wasm::Module::removeExport(NVar18);
        }
        local_98 = local_98 + 1;
      }
      ProgramResult::ProgramResult((ProgramResult *)&__range3);
      bVar3 = writeAndTestReduction(this,(ProgramResult *)&__range3);
      if (bVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"|      removed ");
        sVar7 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                          ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
        std::operator<<(poVar6," exports\n");
        sVar7 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                          ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        noteReduction(this,sVar7);
        local_70 = i + local_70;
        local_170[0] = (unsigned_long)this->factor;
        uStack_178 = i << 1;
        puVar13 = std::min<unsigned_long>(local_170,&stack0xfffffffffffffe88);
        i = *puVar13;
      }
      else {
        __end3 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::begin
                           ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        exp_2._32_8_ = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::end
                                 ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
                                           *)&exp_2.kind), bVar3) {
          pEVar11 = __gnu_cxx::
                    __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
                    ::operator*(&__end3);
          exp_2.value.super_IString.str._M_str = *(char **)&pEVar11->kind;
          sStack_158 = (pEVar11->name).super_IString.str._M_len;
          exp_2.name.super_IString.str._M_len = (size_t)(pEVar11->name).super_IString.str._M_str;
          exp_2.name.super_IString.str._M_str = (char *)(pEVar11->value).super_IString.str._M_len;
          exp_2.value.super_IString.str._M_len = (size_t)(pEVar11->value).super_IString.str._M_str;
          pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                             (&this->module);
          psVar12 = (size_t *)operator_new(0x28);
          psVar12[4] = (size_t)exp_2.value.super_IString.str._M_str;
          psVar12[2] = (size_t)exp_2.name.super_IString.str._M_str;
          psVar12[3] = exp_2.value.super_IString.str._M_len;
          *psVar12 = sStack_158;
          psVar12[1] = exp_2.name.super_IString.str._M_len;
          wasm::Module::addExport((Export *)pMVar5);
          __gnu_cxx::
          __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
          ::operator++(&__end3);
        }
        local_160 = i >> 1;
        local_170[1] = 1;
        puVar13 = std::max<unsigned_long>(&local_160,local_170 + 1);
        i = *puVar13;
      }
      ProgramResult::~ProgramResult((ProgramResult *)&__range3);
      std::vector<wasm::Export,_std::allocator<wasm::Export>_>::~vector
                ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
    }
  }
  pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  iVar14 = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::begin(&pMVar5->elementSegments);
  pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  iVar15 = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::end(&pMVar5->elementSegments);
  bVar3 = std::
          all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,Reducer::visitModule(wasm::Module*)::_lambda(auto:1&)_1_>
                    (iVar14._M_current,iVar15._M_current);
  pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  sVar7 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::size(&pMVar5->functions);
  if (sVar7 == 1) {
    pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                       (&this->module);
    bVar4 = std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::empty(&pMVar5->exports);
    if ((bVar4) && (bVar3)) {
      pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                         (&this->module);
      this_01 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::operator[](&pMVar5->functions,0);
      this_02 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_01);
      bVar3 = wasm::Importable::imported(&this_02->super_Importable);
      if ((!bVar3) && (bVar3 = wasm::Properties::isNamedControlFlow(this_02->body), !bVar3)) {
        uVar1 = (this_02->type).id;
        pEVar2 = this_02->body;
        wasm::ChildIterator::ChildIterator((ChildIterator *)&__begin3_1.index,this_02->body);
        IVar19 = wasm::AbstractChildIterator<wasm::ChildIterator>::begin
                           ((AbstractChildIterator<wasm::ChildIterator> *)&__begin3_1.index);
        __end3_1._8_8_ = IVar19.parent;
        __begin3_1.parent._0_4_ = IVar19.index;
        local_208 = (undefined1  [8])__end3_1._8_8_;
        IVar19 = wasm::AbstractChildIterator<wasm::ChildIterator>::end
                           ((AbstractChildIterator<wasm::ChildIterator> *)&__begin3_1.index);
        local_238 = IVar19.parent;
        local_230 = IVar19.index;
        local_228 = (undefined1  [8])local_238;
        __end3_1.parent._0_4_ = local_230;
        while (bVar3 = wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                                 ((Iterator *)local_208,(Iterator *)local_228), bVar3) {
          ppEVar16 = wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                               ((Iterator *)local_208);
          local_248 = *ppEVar16;
          bVar3 = wasm::Type::isConcrete(&local_248->type);
          local_339 = true;
          if (!bVar3) {
            local_24c = none;
            local_339 = wasm::Type::operator==(&local_248->type,&local_24c);
          }
          if (((local_339 ^ 0xffU) & 1) == 0) {
            params.id = wasm::HeapType::getSignature();
            wasm::Signature::Signature(&local_268,params,(Type)(local_248->type).id);
            wasm::HeapType::HeapType(&local_258,local_268);
            (this_02->type).id = local_258.id;
            this_02->body = local_248;
            bVar3 = writeAndTestReduction(this);
            if (bVar3) {
              std::operator<<((ostream *)&std::cerr,"|    altered function result type\n");
              noteReduction(this,1);
              break;
            }
            (this_02->type).id = uVar1;
            this_02->body = pEVar2;
          }
          wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++
                    ((Iterator *)local_208);
        }
        child._4_4_ = 0xe;
        wasm::ChildIterator::~ChildIterator((ChildIterator *)&__begin3_1.index);
      }
    }
  }
  std::vector<wasm::Export,_std::allocator<wasm::Export>_>::~vector
            ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1);
  return;
}

Assistant:

void visitModule(Module* curr) {
    // The initial module given to us is our global object. As we continue to
    // process things here, we may replace the module, so we should never again
    // refer to curr.
    assert(curr == module.get());
    curr = nullptr;

    // Reduction of entire functions at a time is very effective, and we do it
    // with exponential growth and backoff, so keep doing it while it works.
    while (reduceFunctions()) {
    }

    shrinkElementSegments();

    // try to remove exports
    std::cerr << "|    try to remove exports (with factor " << factor << ")\n";
    std::vector<Export> exports;
    for (auto& exp : module->exports) {
      exports.push_back(*exp);
    }
    size_t skip = 1;
    for (size_t i = 0; i < exports.size(); i++) {
      if (!shouldTryToReduce(std::max((factor / 100) + 1, 1000))) {
        continue;
      }
      std::vector<Export> currExports;
      for (size_t j = 0; currExports.size() < skip && i + j < exports.size();
           j++) {
        auto exp = exports[i + j];
        if (module->getExportOrNull(exp.name)) {
          currExports.push_back(exp);
          module->removeExport(exp.name);
        }
      }
      ProgramResult result;
      if (!writeAndTestReduction(result)) {
        for (auto exp : currExports) {
          module->addExport(new Export(exp));
        }
        skip = std::max(skip / 2, size_t(1)); // or 1?
      } else {
        std::cerr << "|      removed " << currExports.size() << " exports\n";
        noteReduction(currExports.size());
        i += skip;
        skip = std::min(size_t(factor), 2 * skip);
      }
    }
    // If we are left with a single function that is not exported or used in
    // a table, that is useful as then we can change the return type.
    bool allTablesEmpty =
      std::all_of(module->elementSegments.begin(),
                  module->elementSegments.end(),
                  [&](auto& segment) { return segment->data.empty(); });

    if (module->functions.size() == 1 && module->exports.empty() &&
        allTablesEmpty) {
      auto* func = module->functions[0].get();
      // We can't remove something that might have breaks to it.
      if (!func->imported() && !Properties::isNamedControlFlow(func->body)) {
        auto funcType = func->type;
        auto* funcBody = func->body;
        for (auto* child : ChildIterator(func->body)) {
          if (!(child->type.isConcrete() || child->type == Type::none)) {
            continue; // not something a function can return
          }
          // Try to replace the body with the child, fixing up the function
          // to accept it.
          func->type = Signature(funcType.getSignature().params, child->type);
          func->body = child;
          if (writeAndTestReduction()) {
            // great, we succeeded!
            std::cerr << "|    altered function result type\n";
            noteReduction(1);
            break;
          }
          // Undo.
          func->type = funcType;
          func->body = funcBody;
        }
      }
    }
  }